

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::SIMDExtract::finalize(SIMDExtract *this)

{
  Expression *pEVar1;
  
  pEVar1 = this->vec;
  if (pEVar1 == (Expression *)0x0) {
    __assert_fail("vec",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                  ,0x176,"void wasm::SIMDExtract::finalize()");
  }
  if ((ulong)this->op < 9) {
    (this->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id =
         *(uintptr_t *)(&DAT_00e2e698 + (ulong)this->op * 8);
    if ((pEVar1->type).id == 1) {
      (this->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 1;
    }
    return;
  }
  handle_unreachable("unexpected op",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                     ,0x18a);
}

Assistant:

void SIMDExtract::finalize() {
  assert(vec);
  switch (op) {
    case ExtractLaneSVecI8x16:
    case ExtractLaneUVecI8x16:
    case ExtractLaneSVecI16x8:
    case ExtractLaneUVecI16x8:
    case ExtractLaneVecI32x4:
      type = Type::i32;
      break;
    case ExtractLaneVecI64x2:
      type = Type::i64;
      break;
    case ExtractLaneVecF16x8:
    case ExtractLaneVecF32x4:
      type = Type::f32;
      break;
    case ExtractLaneVecF64x2:
      type = Type::f64;
      break;
    default:
      WASM_UNREACHABLE("unexpected op");
  }
  if (vec->type == Type::unreachable) {
    type = Type::unreachable;
  }
}